

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.cpp
# Opt level: O0

ScalarFunction * duckdb::RpadFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  ScalarFunction *func;
  allocator_type *in_stack_fffffffffffffdd8;
  BaseScalarFunction *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffde0;
  BaseScalarFunction *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  LogicalTypeId in_stack_fffffffffffffdff;
  LogicalType *in_stack_fffffffffffffe00;
  undefined1 **local_1b8;
  bind_scalar_function_extended_t in_stack_ffffffffffffff00;
  bind_scalar_function_t in_stack_ffffffffffffff08;
  scalar_function_t *in_stack_ffffffffffffff10;
  LogicalType *in_stack_ffffffffffffff18;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff20;
  ScalarFunction *in_stack_ffffffffffffff28;
  function_statistics_t in_stack_ffffffffffffff60;
  init_local_state_t in_stack_ffffffffffffff68;
  LogicalType *in_stack_ffffffffffffff70;
  FunctionStability side_effects;
  FunctionNullHandling in_stack_ffffffffffffff80;
  bind_lambda_function_t in_stack_ffffffffffffff88;
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_9;
  
  local_9 = 0;
  LogicalType::LogicalType(in_stack_fffffffffffffe00,in_stack_fffffffffffffdff);
  LogicalType::LogicalType(in_stack_fffffffffffffe00,in_stack_fffffffffffffdff);
  side_effects = (FunctionStability)local_50;
  LogicalType::LogicalType(in_stack_fffffffffffffe00,in_stack_fffffffffffffdff);
  local_38 = &stack0xffffffffffffff80;
  local_30 = 3;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2144dcc);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffdf0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffde8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffdf4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffde0,iVar1,in_stack_fffffffffffffdd8);
  LogicalType::LogicalType(in_stack_fffffffffffffe00,in_stack_fffffffffffffdff);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8
            );
  LogicalType::LogicalType(in_stack_fffffffffffffe00,in_stack_fffffffffffffdff);
  this = (BaseScalarFunction *)0x0;
  function = (BaseScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
             side_effects,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  LogicalType::~LogicalType((LogicalType *)0x2144e99);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2144ea6);
  LogicalType::~LogicalType((LogicalType *)0x2144eb3);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2144ec0);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2144ecd);
  local_1b8 = &local_38;
  do {
    local_1b8 = local_1b8 + -3;
    LogicalType::~LogicalType((LogicalType *)0x2144ef6);
  } while (local_1b8 != (undefined1 **)&stack0xffffffffffffff80);
  BaseScalarFunction::SetReturnsError(function);
  BaseScalarFunction::~BaseScalarFunction(this);
  return in_RDI;
}

Assistant:

ScalarFunction RpadFun::GetFunction() {
	ScalarFunction func({LogicalType::VARCHAR, LogicalType::INTEGER, LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                    PadFunction<RightPadOperator>);
	BaseScalarFunction::SetReturnsError(func);
	return func;
}